

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CMU462::StaticScene::InfiniteHemisphereLight::InfiniteHemisphereLight
          (InfiniteHemisphereLight *this,Spectrum *rad)

{
  float fVar1;
  Vector3D *pVVar2;
  Vector3D local_70;
  Vector3D local_58;
  Vector3D local_30;
  Spectrum *local_18;
  Spectrum *rad_local;
  InfiniteHemisphereLight *this_local;
  
  local_18 = rad;
  rad_local = (Spectrum *)this;
  SceneLight::SceneLight(&this->super_SceneLight);
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_00394ad8;
  (this->radiance).b = local_18->b;
  fVar1 = local_18->g;
  (this->radiance).r = local_18->r;
  (this->radiance).g = fVar1;
  Matrix3x3::Matrix3x3(&this->sampleToWorld);
  UniformHemisphereSampler3D::UniformHemisphereSampler3D(&this->sampler);
  Vector3D::Vector3D(&local_30,1.0,0.0,0.0);
  pVVar2 = Matrix3x3::operator[](&this->sampleToWorld,0);
  pVVar2->z = local_30.z;
  pVVar2->x = local_30.x;
  pVVar2->y = local_30.y;
  Vector3D::Vector3D(&local_58,0.0,0.0,-1.0);
  pVVar2 = Matrix3x3::operator[](&this->sampleToWorld,1);
  pVVar2->z = local_58.z;
  pVVar2->x = local_58.x;
  pVVar2->y = local_58.y;
  Vector3D::Vector3D(&local_70,0.0,1.0,0.0);
  pVVar2 = Matrix3x3::operator[](&this->sampleToWorld,2);
  pVVar2->x = local_70.x;
  pVVar2->y = local_70.y;
  pVVar2->z = local_70.z;
  return;
}

Assistant:

InfiniteHemisphereLight::InfiniteHemisphereLight(const Spectrum& rad)
    : radiance(rad) {
  sampleToWorld[0] = Vector3D(1,  0,  0);
  sampleToWorld[1] = Vector3D(0,  0, -1);
  sampleToWorld[2] = Vector3D(0,  1,  0);
}